

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateParsingConstructor
          (ImmutableMessageGenerator *this,Printer *printer)

{
  FieldDescriptor *this_00;
  int iVar1;
  Type TVar2;
  ImmutableFieldGenerator *pIVar3;
  Descriptor *pDVar4;
  FieldDescriptor **ppFVar5;
  int i;
  int i_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar6;
  uint uVar7;
  long lVar8;
  char *text;
  int iVar9;
  long lVar10;
  scoped_array<const_google::protobuf::FieldDescriptor_*> sorted_fields;
  string local_60;
  scoped_array<const_google::protobuf::FieldDescriptor_*> local_40;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *local_38;
  
  local_40.array_ = SortFieldsByNumber((this->super_MessageGenerator).descriptor_);
  io::Printer::Print(printer,
                     "private $classname$(\n    com.google.protobuf.CodedInputStream input,\n    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n"
                     ,"classname",*(string **)(this->super_MessageGenerator).descriptor_);
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"this();\n");
  pDVar4 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar4 + 0x2c)) {
    lVar10 = 0;
    lVar8 = 0;
    iVar9 = 0;
    do {
      pIVar3 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (&this->field_generators_,
                          (FieldDescriptor *)(*(long *)(pDVar4 + 0x30) + lVar10));
      iVar1 = (*pIVar3->_vptr_ImmutableFieldGenerator[3])(pIVar3);
      iVar9 = iVar9 + iVar1;
      lVar8 = lVar8 + 1;
      pDVar4 = (this->super_MessageGenerator).descriptor_;
      lVar10 = lVar10 + 0xa8;
    } while (lVar8 < *(int *)(pDVar4 + 0x2c));
    if (0 < iVar9) {
      uVar7 = 0;
      uVar6 = extraout_RDX;
      do {
        GetBitFieldName_abi_cxx11_(&local_60,(java *)(ulong)uVar7,(int)uVar6);
        io::Printer::Print(printer,"int mutable_$bit_field_name$ = 0;\n","bit_field_name",&local_60)
        ;
        uVar6 = extraout_RDX_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          uVar6 = extraout_RDX_01;
        }
        uVar7 = uVar7 + 1;
      } while (iVar9 + 0x1fU >> 5 != uVar7);
      pDVar4 = (this->super_MessageGenerator).descriptor_;
    }
  }
  if (*(int *)(*(long *)(pDVar4 + 0x10) + 0x8c) != 3) {
    io::Printer::Print(printer,
                       "com.google.protobuf.UnknownFieldSet.Builder unknownFields =\n    com.google.protobuf.UnknownFieldSet.newBuilder();\n"
                      );
  }
  io::Printer::Print(printer,"try {\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"boolean done = false;\nwhile (!done) {\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"int tag = input.readTag();\nswitch (tag) {\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"case 0:\n  done = true;\n  break;\n");
  text = 
  "default: {\n  if (!parseUnknownField(input, unknownFields,\n                         extensionRegistry, tag)) {\n    done = true;\n  }\n  break;\n}\n"
  ;
  if (*(int *)(*(long *)((this->super_MessageGenerator).descriptor_ + 0x10) + 0x8c) == 3) {
    text = "default: {\n  if (!input.skipField(tag)) {\n    done = true;\n  }\n  break;\n}\n";
  }
  io::Printer::Print(printer,text);
  if (0 < *(int *)((this->super_MessageGenerator).descriptor_ + 0x2c)) {
    local_38 = &this->field_generators_;
    lVar8 = 0;
    do {
      ppFVar5 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                          (&local_40,lVar8);
      this_00 = *ppFVar5;
      iVar9 = *(int *)(this_00 + 0x38);
      TVar2 = FieldDescriptor::type(this_00);
      SimpleItoa_abi_cxx11_
                (&local_60,
                 (protobuf *)
                 (ulong)(iVar9 << 3 |
                        *(uint *)(internal::WireFormatLite::kWireTypeForFieldType + (ulong)TVar2 * 4
                                 )),i);
      io::Printer::Print(printer,"case $tag$: {\n","tag",&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      io::Printer::Indent(printer);
      pIVar3 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (local_38,this_00);
      (*pIVar3->_vptr_ImmutableFieldGenerator[0xb])(pIVar3,printer);
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"  break;\n}\n");
      if (*(int *)(this_00 + 0x4c) == 3) {
        TVar2 = FieldDescriptor::type(this_00);
        if (TVar2 - TYPE_UINT32 < 0xfffffffc) {
          SimpleItoa_abi_cxx11_
                    (&local_60,(protobuf *)(ulong)(*(int *)(this_00 + 0x38) * 8 + 2),i_00);
          io::Printer::Print(printer,"case $tag$: {\n","tag",&local_60);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          io::Printer::Indent(printer);
          pIVar3 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                             (local_38,this_00);
          (*pIVar3->_vptr_ImmutableFieldGenerator[0xc])(pIVar3,printer);
          io::Printer::Outdent(printer);
          io::Printer::Print(printer,"  break;\n}\n");
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < *(int *)((this->super_MessageGenerator).descriptor_ + 0x2c));
  }
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"  }\n}\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,
                     "} catch (com.google.protobuf.InvalidProtocolBufferException e) {\n  throw e.setUnfinishedMessage(this);\n} catch (java.io.IOException e) {\n  throw new com.google.protobuf.InvalidProtocolBufferException(\n      e).setUnfinishedMessage(this);\n} finally {\n"
                    );
  io::Printer::Indent(printer);
  pDVar4 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar4 + 0x2c)) {
    lVar8 = 0;
    do {
      ppFVar5 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                          (&local_40,lVar8);
      pIVar3 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (&this->field_generators_,*ppFVar5);
      (*pIVar3->_vptr_ImmutableFieldGenerator[0xd])(pIVar3,printer);
      lVar8 = lVar8 + 1;
      pDVar4 = (this->super_MessageGenerator).descriptor_;
    } while (lVar8 < *(int *)(pDVar4 + 0x2c));
  }
  if (*(int *)(*(long *)(pDVar4 + 0x10) + 0x8c) != 3) {
    io::Printer::Print(printer,"this.unknownFields = unknownFields.build();\n");
  }
  io::Printer::Print(printer,"makeExtensionsImmutable();\n");
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"  }\n}\n");
  if (local_40.array_ != (FieldDescriptor **)0x0) {
    operator_delete__(local_40.array_);
  }
  return;
}

Assistant:

void ImmutableMessageGenerator::
GenerateParsingConstructor(io::Printer* printer) {
  google::protobuf::scoped_array<const FieldDescriptor * > sorted_fields(
      SortFieldsByNumber(descriptor_));

  printer->Print(
      "private $classname$(\n"
      "    com.google.protobuf.CodedInputStream input,\n"
      "    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n"
      "    throws com.google.protobuf.InvalidProtocolBufferException {\n",
      "classname", descriptor_->name());
  printer->Indent();

  // Initialize all fields to default.
  printer->Print(
      "this();\n");

  // Use builder bits to track mutable repeated fields.
  int totalBuilderBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const ImmutableFieldGenerator& field =
        field_generators_.get(descriptor_->field(i));
    totalBuilderBits += field.GetNumBitsForBuilder();
  }
  int totalBuilderInts = (totalBuilderBits + 31) / 32;
  for (int i = 0; i < totalBuilderInts; i++) {
    printer->Print("int mutable_$bit_field_name$ = 0;\n",
      "bit_field_name", GetBitFieldName(i));
  }

  if (PreserveUnknownFields(descriptor_)) {
    printer->Print(
      "com.google.protobuf.UnknownFieldSet.Builder unknownFields =\n"
      "    com.google.protobuf.UnknownFieldSet.newBuilder();\n");
  }

  printer->Print(
      "try {\n");
  printer->Indent();

  printer->Print(
    "boolean done = false;\n"
    "while (!done) {\n");
  printer->Indent();

  printer->Print(
    "int tag = input.readTag();\n"
    "switch (tag) {\n");
  printer->Indent();

  printer->Print(
    "case 0:\n"          // zero signals EOF / limit reached
    "  done = true;\n"
    "  break;\n");

  if (PreserveUnknownFields(descriptor_)) {
    printer->Print(
      "default: {\n"
      "  if (!parseUnknownField(input, unknownFields,\n"
      "                         extensionRegistry, tag)) {\n"
      "    done = true;\n"  // it's an endgroup tag
      "  }\n"
      "  break;\n"
      "}\n");
  } else {
    printer->Print(
      "default: {\n"
      "  if (!input.skipField(tag)) {\n"
      "    done = true;\n"  // it's an endgroup tag
      "  }\n"
      "  break;\n"
      "}\n");
  }

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = sorted_fields[i];
    uint32 tag = WireFormatLite::MakeTag(field->number(),
      WireFormat::WireTypeForFieldType(field->type()));

    printer->Print(
      "case $tag$: {\n",
      "tag", SimpleItoa(static_cast<int32>(tag)));
    printer->Indent();

    field_generators_.get(field).GenerateParsingCode(printer);

    printer->Outdent();
    printer->Print(
      "  break;\n"
      "}\n");

    if (field->is_packable()) {
      // To make packed = true wire compatible, we generate parsing code from a
      // packed version of this field regardless of field->options().packed().
      uint32 packed_tag = WireFormatLite::MakeTag(field->number(),
        WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
      printer->Print(
        "case $tag$: {\n",
        "tag", SimpleItoa(static_cast<int32>(packed_tag)));
      printer->Indent();

      field_generators_.get(field).GenerateParsingCodeFromPacked(printer);

      printer->Outdent();
      printer->Print(
        "  break;\n"
        "}\n");
    }
  }

  printer->Outdent();
  printer->Outdent();
  printer->Print(
      "  }\n"     // switch (tag)
      "}\n");     // while (!done)

  printer->Outdent();
  printer->Print(
      "} catch (com.google.protobuf.InvalidProtocolBufferException e) {\n"
      "  throw e.setUnfinishedMessage(this);\n"
      "} catch (java.io.IOException e) {\n"
      "  throw new com.google.protobuf.InvalidProtocolBufferException(\n"
      "      e).setUnfinishedMessage(this);\n"
      "} finally {\n");
  printer->Indent();

  // Make repeated field list immutable.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = sorted_fields[i];
    field_generators_.get(field).GenerateParsingDoneCode(printer);
  }

  if (PreserveUnknownFields(descriptor_)) {
    // Make unknown fields immutable.
    printer->Print("this.unknownFields = unknownFields.build();\n");
  }

  // Make extensions immutable.
  printer->Print(
      "makeExtensionsImmutable();\n");

  printer->Outdent();
  printer->Outdent();
  printer->Print(
      "  }\n"     // finally
      "}\n");
}